

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmTextureCalc::SetPlaneUnAlignedTexOffsetInfo
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t YHeight,uint32_t VHeight)

{
  uint32_t uVar1;
  
  *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x50) = (ulong)YHeight;
  uVar1 = (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes;
  if (uVar1 == 3) {
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x60) = (ulong)VHeight;
  }
  else if (uVar1 != 2) {
    return;
  }
  *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x58) = (ulong)VHeight;
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::SetPlaneUnAlignedTexOffsetInfo(GMM_TEXTURE_INFO *pTexInfo, uint32_t YHeight, uint32_t VHeight)
{
    uint32_t UmdUHeight = 0, UmdVHeight = 0;

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = YHeight;
    if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] = VHeight;
        UmdUHeight                                               = (GMM_GLOBAL_GFX_SIZE_T)((pTexInfo->Size / pTexInfo->Pitch) - pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U]);
    }
    else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] =
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_V] = VHeight;
        UmdUHeight                                               = (GMM_GLOBAL_GFX_SIZE_T)(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_V] - pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U]);
        UmdVHeight                                               = (GMM_GLOBAL_GFX_SIZE_T)(((pTexInfo->Size / pTexInfo->Pitch) - pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U]) / 2);
        __GMM_ASSERTPTR((UmdUHeight == UmdVHeight), VOIDRETURN);
    }

    __GMM_ASSERTPTR(((pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U] == YHeight) && (UmdUHeight == VHeight)), VOIDRETURN);
}